

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack12_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar2 = *(ulong *)in;
  uVar1 = in[8];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6 = vpshufd_avx(auVar6,0x50);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x1004180c));
  *out = (uint)uVar2 & 0xfff;
  uVar4 = (uint)(uVar2 >> 0x20);
  auVar9 = vpsrlvd_avx2(auVar6,auVar3);
  auVar7._8_4_ = 0xfff;
  auVar7._0_8_ = 0xfff00000fff;
  auVar7._12_4_ = 0xfff;
  auVar8 = vpinsrd_avx(auVar7,(uVar4 & 0xf) << 8,1);
  uVar5 = in[2];
  auVar6 = vpand_avx(auVar9,auVar7);
  auVar8 = vpor_avx(auVar9,auVar8);
  auVar6 = vpblendd_avx2(auVar6,auVar8,2);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  out[5] = uVar4 >> 0x1c | (uVar5 & 0xff) << 4;
  out[6] = uVar5 >> 8 & 0xfff;
  out[7] = uVar5 >> 0x14;
  uVar2 = *(ulong *)(in + 3);
  out[8] = (uint)uVar2 & 0xfff;
  uVar4 = (uint)(uVar2 >> 0x20);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  auVar6 = vpshufd_avx(auVar8,0x50);
  auVar9 = vpsrlvd_avx2(auVar6,auVar3);
  auVar8 = vpinsrd_avx(auVar7,(uVar4 & 0xf) << 8,1);
  uVar5 = in[5];
  auVar6 = vpand_avx(auVar9,auVar7);
  auVar8 = vpor_avx(auVar9,auVar8);
  auVar6 = vpblendd_avx2(auVar6,auVar8,2);
  *(undefined1 (*) [16])(out + 9) = auVar6;
  out[0xd] = uVar4 >> 0x1c | (uVar5 & 0xff) << 4;
  out[0xe] = uVar5 >> 8 & 0xfff;
  uVar2 = *(ulong *)(in + 6);
  out[0xf] = uVar5 >> 0x14;
  uVar5 = (uint)(uVar2 >> 0x20);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar6 = vpshufd_avx(auVar9,0x50);
  out[0x10] = (uint)uVar2 & 0xfff;
  auVar3 = vpsrlvd_avx2(auVar6,auVar3);
  auVar8 = vpinsrd_avx(auVar7,(uVar5 & 0xf) << 8,1);
  auVar6 = vpand_avx(auVar3,auVar7);
  auVar8 = vpor_avx(auVar3,auVar8);
  auVar6 = vpblendd_avx2(auVar6,auVar8,2);
  *(undefined1 (*) [16])(out + 0x11) = auVar6;
  out[0x15] = uVar5 >> 0x1c | (uVar1 & 0xff) << 4;
  out[0x16] = uVar1 >> 8 & 0xfff;
  out[0x17] = uVar1 >> 0x14;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack12_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;

  return in;
}